

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

void __thiscall Clasp::ClaspFacade::SolveStrategy::Async::doStart(Async *this)

{
  __int_type _Var1;
  mem_fun1_t<void,_Clasp::ClaspFacade::SolveStrategy,_Clasp::SolveMode_t> *__args;
  mem_fun1_t<void,_Clasp::ClaspFacade::SolveStrategy,_Clasp::SolveMode_t> *__f;
  mutex_type *in_RDI;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> *in_stack_ffffffffffffffb0;
  __atomic_base<unsigned_int> *in_stack_ffffffffffffffb8;
  E *__args_1;
  thread *in_stack_fffffffffffffff0;
  
  (**(code **)(**(long **)((long)&(in_RDI->super___mutex_base)._M_mutex + 0x10) + 0x20))();
  __args_1 = (E *)0x0;
  __args = std::mem_fun<void,Clasp::ClaspFacade::SolveStrategy,Clasp::SolveMode_t>
                     ((offset_in_SolveStrategy_to_subr)in_stack_ffffffffffffffb8);
  std::thread::
  thread<std::mem_fun1_t<void,Clasp::ClaspFacade::SolveStrategy,Clasp::SolveMode_t>,Clasp::ClaspFacade::SolveStrategy::Async*,Clasp::SolveMode_t::E,void>
            (in_stack_fffffffffffffff0,__f,(Async **)__args,__args_1);
  std::thread::swap((thread *)in_stack_ffffffffffffffb0,(thread *)in_RDI);
  std::thread::~thread((thread *)0x12ade6);
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffb0,in_RDI);
  while( true ) {
    _Var1 = std::__atomic_base::operator_cast_to_unsigned_int(in_stack_ffffffffffffffb8);
    if (_Var1 != 0) break;
    std::condition_variable::wait
              ((unique_lock *)(in_RDI[3].super___mutex_base._M_mutex.__size + 0x10));
  }
  std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffffb0);
  return;
}

Assistant:

virtual void doStart() {
		algo_->enableInterrupts();
		Clasp::mt::thread(std::mem_fun(&SolveStrategy::startAlgo), this, SolveMode_t::Async).swap(task_);
		for (mt::unique_lock<Clasp::mt::mutex> lock(mqMutex_); state_ == 0u;) {
			mqCond_.wait(lock);
		}
	}